

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Matrix6x6 * __thiscall iDynTree::Transform::asAdjointTransformWrench(Transform *this)

{
  double *dataPtr;
  VectorFixSize<3U> *this_00;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *other;
  MatrixFixSize<3U,_3U> *this_01;
  Transform *in_RSI;
  Stride<0,_0> *in_RDI;
  Matrix6x6 *ret;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> R;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> p;
  Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> retEigen;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe38;
  Stride<0,_0> *this_02;
  Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffe50;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff88;
  
  this_02 = in_RDI;
  MatrixFixSize<6U,_6U>::MatrixFixSize((MatrixFixSize<6U,_6U> *)in_RDI);
  dataPtr = MatrixFixSize<6U,_6U>::data((MatrixFixSize<6U,_6U> *)this_02);
  Eigen::Stride<0,_0>::Stride(this_02);
  Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffffe50,dataPtr,this_02);
  this_00 = &getPosition(in_RSI)->super_Vector3;
  other = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
           *)VectorFixSize<3U>::data(this_00);
  Eigen::Stride<0,_0>::Stride(this_02);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)other,
             dataPtr,this_02);
  this_01 = &getRotation(in_RSI)->super_Matrix3x3;
  MatrixFixSize<3U,_3U>::data(this_01);
  Eigen::Stride<0,_0>::Stride(this_02);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)other,
             dataPtr,this_02);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RSI,(Index)other,(Index)dataPtr);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_02,in_stack_fffffffffffffe38);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RSI,(Index)other,(Index)dataPtr);
  Eigen::
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>_>
             *)this_02);
  mySkew<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (in_stack_ffffffffffffff88);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RSI,other);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RSI,(Index)other,(Index)dataPtr);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_02,
            (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>
             *)in_stack_fffffffffffffe38);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RSI,(Index)other,(Index)dataPtr);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_02,in_stack_fffffffffffffe38);
  return (Matrix6x6 *)in_RDI;
}

Assistant:

Matrix6x6 Transform::asAdjointTransformWrench() const
    {
        Matrix6x6 ret;

        Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(ret.data());

        Eigen::Map<const Eigen::Vector3d> p(this->getPosition().data());
        Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(this->getRotation().data());

        retEigen.block<3,3>(0,0) = R;
        retEigen.block<3,3>(0,3).setZero();
        retEigen.block<3,3>(3,0) = mySkew(p)*R;
        retEigen.block<3,3>(3,3) = R;

        return ret;
    }